

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O1

Matrix * GetCameraViewMatrix(Matrix *__return_storage_ptr__,Camera *camera)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  uVar2 = (camera->position).x;
  uVar5 = (camera->position).y;
  fVar1 = (camera->position).z;
  uVar3 = (camera->target).x;
  uVar6 = (camera->target).y;
  uVar4 = (camera->up).x;
  uVar7 = (camera->up).y;
  fVar9 = (camera->up).z;
  fVar13 = fVar1 - (camera->target).z;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  fVar14 = (float)uVar2 - (float)uVar3;
  fVar15 = (float)uVar5 - (float)uVar6;
  fVar8 = fVar13 * fVar13 + fVar14 * fVar14 + fVar15 * fVar15;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  fVar8 = (float)(-(uint)(fVar8 == 0.0) & 0x3f800000 | ~-(uint)(fVar8 == 0.0) & (uint)(1.0 / fVar8))
  ;
  fVar14 = fVar14 * fVar8;
  fVar15 = fVar15 * fVar8;
  fVar13 = fVar13 * fVar8;
  fVar16 = (float)uVar7 * fVar13 - fVar9 * fVar15;
  fVar12 = fVar9 * fVar14 - fVar13 * (float)uVar4;
  fVar8 = (float)uVar4 * fVar15 - fVar14 * (float)uVar7;
  fVar9 = fVar8 * fVar8 + fVar16 * fVar16 + fVar12 * fVar12;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar9 = (float)(-(uint)(fVar9 == 0.0) & 0x3f800000 | ~-(uint)(fVar9 == 0.0) & (uint)(1.0 / fVar9))
  ;
  fVar16 = fVar16 * fVar9;
  fVar12 = fVar12 * fVar9;
  fVar9 = fVar9 * fVar8;
  fVar8 = fVar15 * fVar9 - fVar12 * fVar13;
  fVar11 = fVar13 * fVar16 - fVar9 * fVar14;
  fVar10 = fVar14 * fVar12 + -fVar15 * fVar16;
  __return_storage_ptr__->m0 = fVar16;
  __return_storage_ptr__->m1 = fVar8;
  __return_storage_ptr__->m2 = fVar14;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m4 = fVar12;
  __return_storage_ptr__->m5 = fVar11;
  __return_storage_ptr__->m6 = fVar15;
  __return_storage_ptr__->m8 = fVar9;
  __return_storage_ptr__->m9 = fVar10;
  __return_storage_ptr__->m10 = fVar13;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  __return_storage_ptr__->m12 = -(fVar9 * fVar1 + fVar16 * (float)uVar2 + fVar12 * (float)uVar5);
  __return_storage_ptr__->m13 = -(fVar10 * fVar1 + fVar8 * (float)uVar2 + fVar11 * (float)uVar5);
  __return_storage_ptr__->m14 = -(fVar13 * fVar1 + fVar14 * (float)uVar2 + (float)uVar5 * fVar15);
  return __return_storage_ptr__;
}

Assistant:

Matrix GetCameraViewMatrix(Camera *camera)
{
    return MatrixLookAt(camera->position, camera->target, camera->up);
}